

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O2

void __thiscall FConfigFile::MoveSectionToStart(FConfigFile *this,char *name)

{
  FConfigSection *pFVar1;
  FConfigSection **ppFVar2;
  FConfigSection *pFVar3;
  FConfigSection **ppFVar4;
  
  pFVar3 = FindSection(this,name);
  if (pFVar3 != (FConfigSection *)0x0) {
    ppFVar2 = &this->Sections;
    do {
      ppFVar4 = ppFVar2;
      pFVar1 = *ppFVar4;
      if (pFVar1 == (FConfigSection *)0x0) break;
      ppFVar2 = &pFVar1->Next;
    } while (pFVar1 != pFVar3);
    *ppFVar4 = pFVar3->Next;
    pFVar3->Next = this->Sections;
    this->Sections = pFVar3;
    if (this->LastSectionPtr == &pFVar3->Next) {
      this->LastSectionPtr = ppFVar4;
    }
  }
  return;
}

Assistant:

void FConfigFile::MoveSectionToStart (const char *name)
{
	FConfigSection *section = FindSection (name);

	if (section != NULL)
	{
		FConfigSection **prevsec = &Sections;
		while (*prevsec != NULL && *prevsec != section)
		{
			prevsec = &((*prevsec)->Next);
		}
		*prevsec = section->Next;
		section->Next = Sections;
		Sections = section;
		if (LastSectionPtr == &section->Next)
		{
			LastSectionPtr = prevsec;
		}
	}
}